

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTree.cpp
# Opt level: O0

bool __thiscall CASC_FILE_TREE::RebuildTreeMaps(CASC_FILE_TREE *this)

{
  PCASC_MAP p_Var1;
  size_t sVar2;
  ulong local_38;
  size_t i;
  size_t sStack_28;
  DWORD DataId;
  size_t nMaxItems;
  PCASC_FILE_NODE pFileNode;
  CASC_FILE_TREE *this_local;
  
  pFileNode = (PCASC_FILE_NODE)this;
  sStack_28 = CASC_ARRAY::ItemCountMax(&this->FileTable);
  i._4_4_ = 0;
  if (this->pNameMap != (PCASC_MAP)0x0) {
    Map_Free(this->pNameMap);
  }
  this->pNameMap = (PCASC_MAP)0x0;
  if (this->pIdMap != (PCASC_MAP)0x0) {
    Map_Free(this->pIdMap);
  }
  this->pIdMap = (PCASC_MAP)0x0;
  p_Var1 = Map_Create(sStack_28,8,0x10);
  this->pNameMap = p_Var1;
  if (this->pNameMap == (PCASC_MAP)0x0) {
    this_local._7_1_ = false;
  }
  else {
    if (this->DataIdOffset != 0) {
      p_Var1 = Map_Create(sStack_28,4,this->DataIdOffset);
      this->pIdMap = p_Var1;
      if (this->pIdMap == (PCASC_MAP)0x0) {
        return false;
      }
    }
    for (local_38 = 0; sVar2 = CASC_ARRAY::ItemCount(&this->FileTable), local_38 < sVar2;
        local_38 = local_38 + 1) {
      nMaxItems = (size_t)CASC_ARRAY::ItemAt(&this->FileTable,local_38);
      if ((void *)nMaxItems != (void *)0x0) {
        if ((this->pNameMap != (PCASC_MAP)0x0) && (*(long *)(nMaxItems + 0x10) != 0)) {
          Map_InsertObject(this->pNameMap,(void *)nMaxItems,(void *)(nMaxItems + 0x10));
        }
        if (((this->DataIdOffset != 0) &&
            (GetExtras(this,(PCASC_FILE_NODE)nMaxItems,(PDWORD)((long)&i + 4),(PDWORD)0x0,
                       (PDWORD)0x0), this->pIdMap != (PCASC_MAP)0x0)) && (i._4_4_ != -1)) {
          Map_InsertObject(this->pIdMap,(void *)nMaxItems,(void *)((long)&i + 4));
        }
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CASC_FILE_TREE::RebuildTreeMaps()
{
    PCASC_FILE_NODE pFileNode;
    size_t nMaxItems = FileTable.ItemCountMax();
    DWORD DataId = 0;

    // Free the map of FullName -> CASC_FILE_NODE
    if(pNameMap != NULL)
        Map_Free(pNameMap);
    pNameMap = NULL;

    // Free the map of DataId -> CASC_FILE_NODE
    if(pIdMap != NULL)
        Map_Free(pIdMap);
    pIdMap = NULL;

    // Create the name map
    pNameMap = Map_Create(nMaxItems, sizeof(ULONGLONG), FIELD_OFFSET(CASC_FILE_NODE, NameHash));
    if(pNameMap == NULL)
        return false;

    // Create the DataId map
    if(DataIdOffset != 0)
    {
        pIdMap = Map_Create(nMaxItems, sizeof(DWORD), DataIdOffset);
        if(pIdMap == NULL)
            return false;
    }

    // Parse all items and insert them to the map
    for(size_t i = 0; i < FileTable.ItemCount(); i++)
    {
        pFileNode = (PCASC_FILE_NODE)FileTable.ItemAt(i);
        if(pFileNode != NULL)
        {
            // Insert the file by name
            if(pNameMap != NULL && pFileNode->NameHash != 0)
                Map_InsertObject(pNameMap, pFileNode, &pFileNode->NameHash);

            // Insert the file by data ID, if supported
            if(DataIdOffset != 0)
            {
                GetExtras(pFileNode, &DataId, NULL, NULL);
                if(pIdMap != NULL && DataId != CASC_INVALID_ID)
                {
                    Map_InsertObject(pIdMap, pFileNode, &DataId);
                }
            }
        }
    }

    return true;
}